

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbar.cpp
# Opt level: O0

void __thiscall QToolBar::setMovable(QToolBar *this,bool movable)

{
  QToolBarPrivate *pQVar1;
  byte in_SIL;
  QToolBarPrivate *d;
  undefined1 in_stack_ffffffffffffffdf;
  
  pQVar1 = d_func((QToolBar *)0x6eace5);
  if (((in_SIL & 1 ^ 0xff) & 1) != (((pQVar1->super_QWidgetPrivate).field_0x256 ^ 0xff) & 1)) {
    (pQVar1->super_QWidgetPrivate).field_0x256 = in_SIL & 1;
    (**(code **)(*(long *)&pQVar1->layout->super_QLayout + 0x70))();
    movableChanged((QToolBar *)0x6ead4d,(bool)in_stack_ffffffffffffffdf);
  }
  return;
}

Assistant:

void QToolBar::setMovable(bool movable)
{
    Q_D(QToolBar);
    if (!movable == !d->movable)
        return;
    d->movable = movable;
    d->layout->invalidate();
    emit movableChanged(d->movable);
}